

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

bool __thiscall cs::codecvt::utf8::is_identifier(utf8 *this,char32_t ch)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  key_arg<char32_t> local_14;
  
  iVar3 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
          ::find<char32_t>((raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                            *)&compiler_type::signals,&local_14,
                           SUB168(ZEXT416((uint)ch) * ZEXT816(0xde5fb9d2630458e9),8) +
                           SUB168(ZEXT416((uint)ch) * ZEXT816(0xde5fb9d2630458e9),0));
  if (iVar3.ctrl_ == (ctrl_t *)(compiler_type::signals + DAT_00265ac8)) {
    if ((uint)ch < 0x80) {
      bVar1 = true;
      if (ch != L'_') {
        iVar2 = iswalnum(ch);
        bVar1 = iVar2 != 0;
      }
    }
    else {
      bVar1 = ch == L'〇' || (uint)(ch + L'\xffffb200') < 0x51f0;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool is_identifier(char32_t ch) override
			{
				if (compiler_type::issignal(ch))
					return false;
				/**
				 * Chinese Character in Unicode Charset
				 * Basic:    0x4E00 - 0x9FA5
				 * Extended: 0x9FA6 - 0x9FEF
				 * Special:  0x3007
				 */
				if (ch > ascii_max)
					return (ch >= 0x4E00 && ch <= 0x9FA5) || (ch >= 0x9FA6 && ch <= 0x9FEF) || ch == 0x3007;
				else
					return ch == '_' || std::iswalnum(ch);
			}